

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodeSetPtr xmlXPathNodeSetMergeAndClear(xmlNodeSetPtr set1,xmlNodeSetPtr set2)

{
  xmlNodePtr ns;
  xmlNodePtr pxVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)set1->nodeNr;
  if (set1->nodeNr < 1) {
    uVar4 = uVar5;
  }
  do {
    if ((long)set2->nodeNr <= (long)uVar5) {
      set2->nodeNr = 0;
      return set1;
    }
    ns = set2->nodeTab[uVar5];
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      pxVar1 = set1->nodeTab[uVar3];
      if (pxVar1 == ns) goto LAB_001b9578;
      if ((((pxVar1->type == XML_NAMESPACE_DECL) && (ns->type == XML_NAMESPACE_DECL)) &&
          ((_xmlNs *)pxVar1->_private == (_xmlNs *)ns->_private)) &&
         (iVar2 = xmlStrEqual((xmlChar *)pxVar1->children,(xmlChar *)ns->children), iVar2 != 0)) {
        xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
        goto LAB_001b9578;
      }
    }
    iVar2 = set1->nodeNr;
    if (set1->nodeMax <= iVar2) {
      iVar2 = xmlXPathNodeSetGrow(set1);
      if (iVar2 < 0) {
        xmlXPathFreeNodeSet(set1);
        xmlXPathNodeSetClear(set2,1);
        return (xmlNodeSetPtr)0x0;
      }
      iVar2 = set1->nodeNr;
    }
    set1->nodeNr = iVar2 + 1;
    set1->nodeTab[iVar2] = ns;
LAB_001b9578:
    set2->nodeTab[uVar5] = (xmlNodePtr)0x0;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static xmlNodeSetPtr
xmlXPathNodeSetMergeAndClear(xmlNodeSetPtr set1, xmlNodeSetPtr set2)
{
    {
	int i, j, initNbSet1;
	xmlNodePtr n1, n2;

	initNbSet1 = set1->nodeNr;
	for (i = 0;i < set2->nodeNr;i++) {
	    n2 = set2->nodeTab[i];
	    /*
	    * Skip duplicates.
	    */
	    for (j = 0; j < initNbSet1; j++) {
		n1 = set1->nodeTab[j];
		if (n1 == n2) {
		    goto skip_node;
		} else if ((n1->type == XML_NAMESPACE_DECL) &&
		    (n2->type == XML_NAMESPACE_DECL))
		{
		    if ((((xmlNsPtr) n1)->next == ((xmlNsPtr) n2)->next) &&
			(xmlStrEqual(((xmlNsPtr) n1)->prefix,
			((xmlNsPtr) n2)->prefix)))
		    {
			/*
			* Free the namespace node.
			*/
			xmlXPathNodeSetFreeNs((xmlNsPtr) n2);
			goto skip_node;
		    }
		}
	    }
	    /*
	    * grow the nodeTab if needed
	    */
            if (set1->nodeNr >= set1->nodeMax) {
                if (xmlXPathNodeSetGrow(set1) < 0)
                    goto error;
            }
	    set1->nodeTab[set1->nodeNr++] = n2;
skip_node:
            set2->nodeTab[i] = NULL;
	}
    }
    set2->nodeNr = 0;
    return(set1);

error:
    xmlXPathFreeNodeSet(set1);
    xmlXPathNodeSetClear(set2, 1);
    return(NULL);
}